

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Arguments in_RAX;
  char *__shmaddr;
  atomic_char *guard;
  Arguments args;
  Arguments local_18;
  
  local_18 = in_RAX;
  parse_arguments(&local_18,argc,argv);
  iVar1 = generate_key("shm");
  iVar1 = shmget(iVar1,(long)local_18.size + 1,0x3b6);
  if (-1 < iVar1) {
    __shmaddr = (char *)shmat(iVar1,(void *)0x0,0);
    *__shmaddr = 's';
    if (0 < local_18.count) {
      do {
        do {
        } while (*__shmaddr != 'c');
        memset(__shmaddr + 1,0x2a,(long)local_18.size);
        LOCK();
        *__shmaddr = 's';
        UNLOCK();
        iVar1 = local_18.count;
        local_18.count = local_18.count + -1;
      } while (1 < iVar1);
    }
    shmdt(__shmaddr);
    return 0;
  }
  throw("Could not get segment");
}

Assistant:

int main(int argc, char* argv[]) {
	// The identifier for the shared memory segment
	int segment_id;

	// The *actual* shared memory, that this and other
	// processes can read and write to as if it were
	// any other plain old memory
	char* shared_memory;

	// Key for the memory segment
	key_t segment_key;

	// Fetch command-line arguments
	struct Arguments args;

	parse_arguments(&args, argc, argv);

	segment_key = generate_key("shm");

	/*
		The call that actually allocates the shared memory segment.
		Arguments:
			1. The shared memory key. This must be unique across the OS.
			2. The number of bytes to allocate. This will be rounded up to the OS'
				 pages size for alignment purposes.
			3. The creation flags and permission bits, we pass IPC_CREAT to ensure
				 that the segment will be created if it does not yet exist. Using
				 0666 for permission flags means read + write permission for the user,
				 group and world.
		The call will return the segment ID if the key was valid,
		else the call fails.
	*/
	segment_id = shmget(segment_key, 1 + args.size, IPC_CREAT | 0666);

	if (segment_id < 0) {
		throw("Could not get segment");
	}

	/*
	Once the shared memory segment has been created, it must be
	attached to the address space of each process that wishes to
	use it. For this, we pass:
		1. The segment ID returned by shmget
		2. A pointer at which to attach the shared memory segment. This
			 address must be page-aligned. If you simply pass NULL, the OS
			 will find a suitable region to attach the segment.
		3. Flags, such as:
			 - SHM_RND: round the second argument (the address at which to
				 attach) down to a multiple of the page size. If you don't
				 pass this flag but specify a non-null address as second argument
				 you must ensure page-alignment yourself.
			 - SHM_RDONLY: attach for reading only (independent of access bits)
	shmat will return a pointer to the address space at which it attached the
	shared memory. Children processes created with fork() inherit this segment.
*/
	shared_memory = (char*)shmat(segment_id, NULL, 0);

	if (shared_memory < (char*)0) {
		throw("Could not attach segment");
	}

	communicate(shared_memory, &args);

	cleanup(shared_memory);

	return EXIT_SUCCESS;
}